

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuickSort.h
# Opt level: O1

void JsUtil::
     QuickSort<Memory::_no_write_barrier_policy,_char,_int_(*)(void_*,_const_void_*,_const_void_*)>
     ::Sort(char *base,size_t nmemb,size_t size,_func_int_void_ptr_void_ptr_void_ptr *comparer,
           void *context)

{
  char *pcVar1;
  char *b;
  char cVar2;
  undefined2 uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  int iVar6;
  size_t i;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  char *pcVar15;
  uint uVar16;
  ulong uVar17;
  char *pcVar18;
  char *pcVar19;
  char *pcVar20;
  size_t local_40;
  
  uVar17 = size >> 3;
LAB_003b217f:
  if (base != (char *)0x0) {
    if (9 < nmemb) goto code_r0x003b2196;
    switch(nmemb) {
    case 2:
      pcVar9 = base + size;
      iVar6 = (*comparer)(context,pcVar9,base);
      break;
    case 3:
      pcVar9 = base + size;
      iVar6 = (*comparer)(context,pcVar9,base);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar9,size);
      }
      iVar6 = (*comparer)(context,base + size * 2,pcVar9);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar9,base + size * 2,size);
      }
      iVar6 = (*comparer)(context,pcVar9,base);
      break;
    case 4:
      pcVar14 = base + size;
      iVar6 = (*comparer)(context,pcVar14,base);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar14,size);
      }
      pcVar20 = base + size * 3;
      pcVar9 = base + size * 2;
      iVar6 = (*comparer)(context,pcVar20,pcVar9);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar9,pcVar20,size);
      }
      iVar6 = (*comparer)(context,pcVar9,base);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar9,size);
      }
      iVar6 = (*comparer)(context,pcVar20,pcVar14);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar14,pcVar20,size);
      }
      iVar6 = (*comparer)(context,pcVar9,pcVar14);
      base = pcVar14;
      break;
    case 5:
      pcVar14 = base + size;
      iVar6 = (*comparer)(context,pcVar14,base);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar14,size);
      }
      pcVar20 = base + size * 4;
      pcVar15 = base + size * 3;
      iVar6 = (*comparer)(context,pcVar20,pcVar15);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar15,pcVar20,size);
      }
      pcVar9 = base + size * 2;
      iVar6 = (*comparer)(context,pcVar20,pcVar9);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar9,pcVar20,size);
      }
      iVar6 = (*comparer)(context,pcVar15,pcVar9);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar9,pcVar15,size);
      }
      iVar6 = (*comparer)(context,pcVar15,base);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar15,size);
      }
      iVar6 = (*comparer)(context,pcVar9,base);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar9,size);
      }
      iVar6 = (*comparer)(context,pcVar20,pcVar14);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar14,pcVar20,size);
      }
      iVar6 = (*comparer)(context,pcVar15,pcVar14);
      goto joined_r0x003b2c78;
    case 6:
      pcVar14 = base + size * 2;
      pcVar20 = base + size;
      iVar6 = (*comparer)(context,pcVar14,pcVar20);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar20,pcVar14,size);
      }
      iVar6 = (*comparer)(context,pcVar14,base);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar14,size);
      }
      iVar6 = (*comparer)(context,pcVar20,base);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar20,size);
      }
      pcVar9 = base + size * 5;
      pcVar1 = base + size * 4;
      iVar6 = (*comparer)(context,pcVar9,pcVar1);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar9,size);
      }
      pcVar15 = base + size * 3;
      iVar6 = (*comparer)(context,pcVar9,pcVar15);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar15,pcVar9,size);
      }
      iVar6 = (*comparer)(context,pcVar1,pcVar15);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar15,pcVar1,size);
      }
      iVar6 = (*comparer)(context,pcVar15,base);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar15,size);
      }
      iVar6 = (*comparer)(context,pcVar1,pcVar20);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar20,pcVar1,size);
      }
      iVar6 = (*comparer)(context,pcVar9,pcVar14);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar14,pcVar9,size);
      }
      iVar6 = (*comparer)(context,pcVar1,pcVar14);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar14,pcVar1,size);
      }
      iVar6 = (*comparer)(context,pcVar15,pcVar20);
      pcVar9 = pcVar15;
joined_r0x003b2c78:
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base + size,pcVar15,size);
      }
      iVar6 = (*comparer)(context,pcVar9,pcVar14);
      base = pcVar14;
      break;
    case 7:
      pcVar14 = base + size * 2;
      pcVar20 = base + size;
      iVar6 = (*comparer)(context,pcVar14,pcVar20);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar20,pcVar14,size);
      }
      iVar6 = (*comparer)(context,pcVar14,base);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar14,size);
      }
      iVar6 = (*comparer)(context,pcVar20,base);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar20,size);
      }
      pcVar1 = base + size * 4;
      pcVar9 = base + size * 3;
      iVar6 = (*comparer)(context,pcVar1,pcVar9);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar9,pcVar1,size);
      }
      pcVar15 = base + size * 6;
      pcVar19 = base + size * 5;
      iVar6 = (*comparer)(context,pcVar15,pcVar19);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar19,pcVar15,size);
      }
      iVar6 = (*comparer)(context,pcVar19,pcVar9);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar9,pcVar19,size);
      }
      iVar6 = (*comparer)(context,pcVar15,pcVar1);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar15,size);
      }
      iVar6 = (*comparer)(context,pcVar19,pcVar1);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar19,size);
      }
      iVar6 = (*comparer)(context,pcVar1,base);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar1,size);
      }
      iVar6 = (*comparer)(context,pcVar9,base);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar9,size);
      }
      iVar6 = (*comparer)(context,pcVar19,pcVar20);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar20,pcVar19,size);
      }
      iVar6 = (*comparer)(context,pcVar15,pcVar14);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar14,pcVar15,size);
      }
      iVar6 = (*comparer)(context,pcVar19,pcVar14);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar14,pcVar19,size);
      }
      iVar6 = (*comparer)(context,pcVar9,pcVar20);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar20,pcVar9,size);
      }
      iVar6 = (*comparer)(context,pcVar1,pcVar14);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar14,pcVar1,size);
      }
      iVar6 = (*comparer)(context,pcVar9,pcVar14);
      base = pcVar14;
      break;
    case 8:
      pcVar14 = base + size;
      iVar6 = (*comparer)(context,pcVar14,base);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar14,size);
      }
      pcVar20 = base + size * 3;
      pcVar1 = base + size * 2;
      iVar6 = (*comparer)(context,pcVar20,pcVar1);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar20,size);
      }
      iVar6 = (*comparer)(context,pcVar1,base);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar1,size);
      }
      iVar6 = (*comparer)(context,pcVar20,pcVar14);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar14,pcVar20,size);
      }
      iVar6 = (*comparer)(context,pcVar1,pcVar14);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar14,pcVar1,size);
      }
      pcVar15 = base + size * 5;
      pcVar9 = base + size * 4;
      iVar6 = (*comparer)(context,pcVar15,pcVar9);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar9,pcVar15,size);
      }
      pcVar18 = base + size * 7;
      pcVar19 = base + size * 6;
      iVar6 = (*comparer)(context,pcVar18,pcVar19);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar19,pcVar18,size);
      }
      iVar6 = (*comparer)(context,pcVar19,pcVar9);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar9,pcVar19,size);
      }
      iVar6 = (*comparer)(context,pcVar18,pcVar15);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar15,pcVar18,size);
      }
      iVar6 = (*comparer)(context,pcVar19,pcVar15);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar15,pcVar19,size);
      }
      iVar6 = (*comparer)(context,pcVar9,base);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar9,size);
      }
      iVar6 = (*comparer)(context,pcVar15,pcVar14);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar14,pcVar15,size);
      }
      iVar6 = (*comparer)(context,pcVar9,pcVar14);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar14,pcVar9,size);
      }
      iVar6 = (*comparer)(context,pcVar19,pcVar1);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar19,size);
      }
      iVar6 = (*comparer)(context,pcVar18,pcVar20);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar20,pcVar18,size);
      }
      iVar6 = (*comparer)(context,pcVar19,pcVar20);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar20,pcVar19,size);
      }
      iVar6 = (*comparer)(context,pcVar9,pcVar1);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar9,size);
      }
      iVar6 = (*comparer)(context,pcVar15,pcVar20);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar20,pcVar15,size);
      }
      iVar6 = (*comparer)(context,pcVar9,pcVar20);
      base = pcVar20;
      break;
    case 9:
      pcVar14 = base + size;
      iVar6 = (*comparer)(context,pcVar14,base);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar14,size);
      }
      pcVar20 = base + size * 4;
      pcVar1 = base + size * 3;
      iVar6 = (*comparer)(context,pcVar20,pcVar1);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar20,size);
      }
      pcVar15 = base + size * 7;
      pcVar9 = base + size * 6;
      iVar6 = (*comparer)(context,pcVar15,pcVar9);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar9,pcVar15,size);
      }
      pcVar19 = base + size * 2;
      iVar6 = (*comparer)(context,pcVar19,pcVar14);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar14,pcVar19,size);
      }
      pcVar18 = base + size * 5;
      iVar6 = (*comparer)(context,pcVar18,pcVar20);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar20,pcVar18,size);
      }
      b = base + size * 8;
      iVar6 = (*comparer)(context,b,pcVar15);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar15,b,size);
      }
      iVar6 = (*comparer)(context,pcVar14,base);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar14,size);
      }
      iVar6 = (*comparer)(context,pcVar20,pcVar1);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar20,size);
      }
      iVar6 = (*comparer)(context,pcVar15,pcVar9);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar9,pcVar15,size);
      }
      iVar6 = (*comparer)(context,pcVar1,base);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar1,size);
      }
      iVar6 = (*comparer)(context,pcVar9,pcVar1);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar1,pcVar9,size);
      }
      iVar6 = (*comparer)(context,pcVar1,base);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar1,size);
      }
      iVar6 = (*comparer)(context,pcVar20,pcVar14);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar14,pcVar20,size);
      }
      iVar6 = (*comparer)(context,pcVar15,pcVar20);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar20,pcVar15,size);
      }
      iVar6 = (*comparer)(context,pcVar20,pcVar14);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar14,pcVar20,size);
      }
      iVar6 = (*comparer)(context,pcVar18,pcVar19);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar19,pcVar18,size);
      }
      iVar6 = (*comparer)(context,b,pcVar18);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar18,b,size);
      }
      iVar6 = (*comparer)(context,pcVar18,pcVar19);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar19,pcVar18,size);
      }
      iVar6 = (*comparer)(context,pcVar1,pcVar14);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar14,pcVar1,size);
      }
      iVar6 = (*comparer)(context,pcVar15,pcVar18);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar18,pcVar15,size);
      }
      iVar6 = (*comparer)(context,pcVar9,pcVar19);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar19,pcVar9,size);
      }
      iVar6 = (*comparer)(context,pcVar9,pcVar20);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar20,pcVar9,size);
      }
      iVar6 = (*comparer)(context,pcVar20,pcVar19);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar19,pcVar20,size);
      }
      iVar6 = (*comparer)(context,pcVar1,pcVar19);
      if (iVar6 < 0) {
        QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(pcVar19,pcVar1,size);
      }
      iVar6 = (*comparer)(context,pcVar9,pcVar18);
      base = pcVar18;
      break;
    default:
      goto switchD_003b2ac5_default;
    }
    if (iVar6 < 0) {
      QuickSortSwap<Memory::_no_write_barrier_policy,_char>::swap(base,pcVar9,size);
      return;
    }
  }
switchD_003b2ac5_default:
  return;
code_r0x003b2196:
  uVar13 = (nmemb >> 2) * size;
  pcVar14 = base + uVar13;
  iVar6 = (*comparer)(context,pcVar14,base);
  uVar16 = (uint)size;
  if ((uVar13 != 0) && (iVar6 < 0)) {
    if (size < 8) {
      if (size < 4) {
        uVar7 = (ulong)(uVar16 & 1);
        if (1 < size) {
          uVar3 = *(undefined2 *)base;
          *(undefined2 *)base = *(undefined2 *)pcVar14;
          *(undefined2 *)pcVar14 = uVar3;
        }
      }
      else {
        uVar7 = (ulong)(uVar16 & 3);
        uVar4 = *(undefined4 *)base;
        *(undefined4 *)base = *(undefined4 *)pcVar14;
        *(undefined4 *)pcVar14 = uVar4;
      }
    }
    else {
      uVar7 = 0;
      do {
        uVar5 = *(undefined8 *)(base + uVar7 * 8);
        *(undefined8 *)(base + uVar7 * 8) = *(undefined8 *)(pcVar14 + uVar7 * 8);
        *(undefined8 *)(pcVar14 + uVar7 * 8) = uVar5;
        uVar7 = uVar7 + 1;
      } while (uVar17 != uVar7);
      uVar7 = (ulong)(uVar16 & 7);
    }
    if (uVar7 != 0) {
      uVar10 = 0;
      do {
        cVar2 = base[uVar10];
        base[uVar10] = pcVar14[uVar10];
        pcVar14[uVar10] = cVar2;
        uVar10 = uVar10 + 1;
      } while (uVar7 != uVar10);
    }
  }
  uVar7 = (nmemb - 1) * size;
  pcVar20 = base + uVar7;
  uVar10 = (nmemb * 3 >> 2) * size;
  pcVar1 = base + uVar10;
  iVar6 = (*comparer)(context,pcVar20,pcVar1);
  if ((uVar10 - uVar7 != 0) && (iVar6 < 0)) {
    if (size < 8) {
      if (size < 4) {
        uVar8 = (ulong)(uVar16 & 1);
        if (1 < size) {
          uVar3 = *(undefined2 *)pcVar1;
          *(undefined2 *)pcVar1 = *(undefined2 *)pcVar20;
          *(undefined2 *)pcVar20 = uVar3;
        }
      }
      else {
        uVar8 = (ulong)(uVar16 & 3);
        uVar4 = *(undefined4 *)pcVar1;
        *(undefined4 *)pcVar1 = *(undefined4 *)pcVar20;
        *(undefined4 *)pcVar20 = uVar4;
      }
    }
    else {
      uVar8 = 0;
      do {
        uVar5 = *(undefined8 *)(pcVar1 + uVar8 * 8);
        *(undefined8 *)(pcVar1 + uVar8 * 8) = *(undefined8 *)(pcVar20 + uVar8 * 8);
        *(undefined8 *)(pcVar20 + uVar8 * 8) = uVar5;
        uVar8 = uVar8 + 1;
      } while (uVar17 != uVar8);
      uVar8 = (ulong)(uVar16 & 7);
    }
    if (uVar8 != 0) {
      uVar11 = 0;
      do {
        cVar2 = pcVar1[uVar11];
        pcVar1[uVar11] = pcVar20[uVar11];
        pcVar20[uVar11] = cVar2;
        uVar11 = uVar11 + 1;
      } while (uVar8 != uVar11);
    }
  }
  uVar8 = (nmemb >> 1) * size;
  pcVar9 = base + uVar8;
  iVar6 = (*comparer)(context,pcVar20,pcVar9);
  if ((uVar8 - uVar7 != 0) && (iVar6 < 0)) {
    if (size < 8) {
      if (size < 4) {
        uVar11 = (ulong)(uVar16 & 1);
        if (1 < size) {
          uVar3 = *(undefined2 *)pcVar9;
          *(undefined2 *)pcVar9 = *(undefined2 *)pcVar20;
          *(undefined2 *)pcVar20 = uVar3;
        }
      }
      else {
        uVar11 = (ulong)(uVar16 & 3);
        uVar4 = *(undefined4 *)pcVar9;
        *(undefined4 *)pcVar9 = *(undefined4 *)pcVar20;
        *(undefined4 *)pcVar20 = uVar4;
      }
    }
    else {
      uVar11 = 0;
      do {
        uVar5 = *(undefined8 *)(pcVar9 + uVar11 * 8);
        *(undefined8 *)(pcVar9 + uVar11 * 8) = *(undefined8 *)(pcVar20 + uVar11 * 8);
        *(undefined8 *)(pcVar20 + uVar11 * 8) = uVar5;
        uVar11 = uVar11 + 1;
      } while (uVar17 != uVar11);
      uVar11 = (ulong)(uVar16 & 7);
    }
    if (uVar11 != 0) {
      uVar12 = 0;
      do {
        cVar2 = pcVar9[uVar12];
        pcVar9[uVar12] = pcVar20[uVar12];
        pcVar20[uVar12] = cVar2;
        uVar12 = uVar12 + 1;
      } while (uVar11 != uVar12);
    }
  }
  iVar6 = (*comparer)(context,pcVar1,pcVar9);
  if ((uVar8 != uVar10) && (iVar6 < 0)) {
    if (size < 8) {
      if (size < 4) {
        uVar11 = (ulong)(uVar16 & 1);
        if (1 < size) {
          uVar3 = *(undefined2 *)pcVar9;
          *(undefined2 *)pcVar9 = *(undefined2 *)pcVar1;
          *(undefined2 *)pcVar1 = uVar3;
        }
      }
      else {
        uVar11 = (ulong)(uVar16 & 3);
        uVar4 = *(undefined4 *)pcVar9;
        *(undefined4 *)pcVar9 = *(undefined4 *)pcVar1;
        *(undefined4 *)pcVar1 = uVar4;
      }
    }
    else {
      uVar11 = 0;
      do {
        uVar5 = *(undefined8 *)(pcVar9 + uVar11 * 8);
        *(undefined8 *)(pcVar9 + uVar11 * 8) = *(undefined8 *)(pcVar1 + uVar11 * 8);
        *(undefined8 *)(pcVar1 + uVar11 * 8) = uVar5;
        uVar11 = uVar11 + 1;
      } while (uVar17 != uVar11);
      uVar11 = (ulong)(uVar16 & 7);
    }
    if (uVar11 != 0) {
      uVar12 = 0;
      do {
        cVar2 = pcVar9[uVar12];
        pcVar9[uVar12] = pcVar1[uVar12];
        pcVar1[uVar12] = cVar2;
        uVar12 = uVar12 + 1;
      } while (uVar11 != uVar12);
    }
  }
  iVar6 = (*comparer)(context,pcVar1,base);
  if ((uVar10 != 0) && (iVar6 < 0)) {
    if (size < 8) {
      if (size < 4) {
        uVar11 = (ulong)(uVar16 & 1);
        if (1 < size) {
          uVar3 = *(undefined2 *)base;
          *(undefined2 *)base = *(undefined2 *)pcVar1;
          *(undefined2 *)pcVar1 = uVar3;
        }
      }
      else {
        uVar11 = (ulong)(uVar16 & 3);
        uVar4 = *(undefined4 *)base;
        *(undefined4 *)base = *(undefined4 *)pcVar1;
        *(undefined4 *)pcVar1 = uVar4;
      }
    }
    else {
      uVar11 = 0;
      do {
        uVar5 = *(undefined8 *)(base + uVar11 * 8);
        *(undefined8 *)(base + uVar11 * 8) = *(undefined8 *)(pcVar1 + uVar11 * 8);
        *(undefined8 *)(pcVar1 + uVar11 * 8) = uVar5;
        uVar11 = uVar11 + 1;
      } while (uVar17 != uVar11);
      uVar11 = (ulong)(uVar16 & 7);
    }
    if (uVar11 != 0) {
      uVar12 = 0;
      do {
        cVar2 = base[uVar12];
        base[uVar12] = pcVar1[uVar12];
        pcVar1[uVar12] = cVar2;
        uVar12 = uVar12 + 1;
      } while (uVar11 != uVar12);
    }
  }
  iVar6 = (*comparer)(context,pcVar9,base);
  if ((uVar8 != 0) && (iVar6 < 0)) {
    if (size < 8) {
      if (size < 4) {
        uVar11 = (ulong)(uVar16 & 1);
        if (1 < size) {
          uVar3 = *(undefined2 *)base;
          *(undefined2 *)base = *(undefined2 *)pcVar9;
          *(undefined2 *)pcVar9 = uVar3;
        }
      }
      else {
        uVar11 = (ulong)(uVar16 & 3);
        uVar4 = *(undefined4 *)base;
        *(undefined4 *)base = *(undefined4 *)pcVar9;
        *(undefined4 *)pcVar9 = uVar4;
      }
    }
    else {
      uVar11 = 0;
      do {
        uVar5 = *(undefined8 *)(base + uVar11 * 8);
        *(undefined8 *)(base + uVar11 * 8) = *(undefined8 *)(pcVar9 + uVar11 * 8);
        *(undefined8 *)(pcVar9 + uVar11 * 8) = uVar5;
        uVar11 = uVar11 + 1;
      } while (uVar17 != uVar11);
      uVar11 = (ulong)(uVar16 & 7);
    }
    if (uVar11 != 0) {
      uVar12 = 0;
      do {
        cVar2 = base[uVar12];
        base[uVar12] = pcVar9[uVar12];
        pcVar9[uVar12] = cVar2;
        uVar12 = uVar12 + 1;
      } while (uVar11 != uVar12);
    }
  }
  iVar6 = (*comparer)(context,pcVar20,pcVar14);
  if ((uVar13 != uVar7) && (iVar6 < 0)) {
    if (size < 8) {
      if (size < 4) {
        uVar11 = (ulong)(uVar16 & 1);
        if (1 < size) {
          uVar3 = *(undefined2 *)pcVar14;
          *(undefined2 *)pcVar14 = *(undefined2 *)pcVar20;
          *(undefined2 *)pcVar20 = uVar3;
        }
      }
      else {
        uVar11 = (ulong)(uVar16 & 3);
        uVar4 = *(undefined4 *)pcVar14;
        *(undefined4 *)pcVar14 = *(undefined4 *)pcVar20;
        *(undefined4 *)pcVar20 = uVar4;
      }
    }
    else {
      uVar11 = 0;
      do {
        uVar5 = *(undefined8 *)(pcVar14 + uVar11 * 8);
        *(undefined8 *)(pcVar14 + uVar11 * 8) = *(undefined8 *)(pcVar20 + uVar11 * 8);
        *(undefined8 *)(pcVar20 + uVar11 * 8) = uVar5;
        uVar11 = uVar11 + 1;
      } while (uVar17 != uVar11);
      uVar11 = (ulong)(uVar16 & 7);
    }
    if (uVar11 != 0) {
      uVar12 = 0;
      do {
        cVar2 = pcVar14[uVar12];
        pcVar14[uVar12] = pcVar20[uVar12];
        pcVar20[uVar12] = cVar2;
        uVar12 = uVar12 + 1;
      } while (uVar11 != uVar12);
    }
  }
  iVar6 = (*comparer)(context,pcVar1,pcVar14);
  if ((uVar13 != uVar10) && (iVar6 < 0)) {
    if (size < 8) {
      if (size < 4) {
        uVar10 = (ulong)(uVar16 & 1);
        if (1 < size) {
          uVar3 = *(undefined2 *)pcVar14;
          *(undefined2 *)pcVar14 = *(undefined2 *)pcVar1;
          *(undefined2 *)pcVar1 = uVar3;
        }
      }
      else {
        uVar10 = (ulong)(uVar16 & 3);
        uVar4 = *(undefined4 *)pcVar14;
        *(undefined4 *)pcVar14 = *(undefined4 *)pcVar1;
        *(undefined4 *)pcVar1 = uVar4;
      }
    }
    else {
      uVar10 = 0;
      do {
        uVar5 = *(undefined8 *)(pcVar14 + uVar10 * 8);
        *(undefined8 *)(pcVar14 + uVar10 * 8) = *(undefined8 *)(pcVar1 + uVar10 * 8);
        *(undefined8 *)(pcVar1 + uVar10 * 8) = uVar5;
        uVar10 = uVar10 + 1;
      } while (uVar17 != uVar10);
      uVar10 = (ulong)(uVar16 & 7);
    }
    if (uVar10 != 0) {
      uVar11 = 0;
      do {
        cVar2 = pcVar14[uVar11];
        pcVar14[uVar11] = pcVar1[uVar11];
        pcVar1[uVar11] = cVar2;
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
  }
  iVar6 = (*comparer)(context,pcVar9,pcVar14);
  if ((uVar13 != uVar8) && (iVar6 < 0)) {
    if (size < 8) {
      if (size < 4) {
        uVar13 = (ulong)(uVar16 & 1);
        if (1 < size) {
          uVar3 = *(undefined2 *)pcVar14;
          *(undefined2 *)pcVar14 = *(undefined2 *)pcVar9;
          *(undefined2 *)pcVar9 = uVar3;
        }
      }
      else {
        uVar13 = (ulong)(uVar16 & 3);
        uVar4 = *(undefined4 *)pcVar14;
        *(undefined4 *)pcVar14 = *(undefined4 *)pcVar9;
        *(undefined4 *)pcVar9 = uVar4;
      }
    }
    else {
      uVar13 = 0;
      do {
        uVar5 = *(undefined8 *)(pcVar14 + uVar13 * 8);
        *(undefined8 *)(pcVar14 + uVar13 * 8) = *(undefined8 *)(pcVar9 + uVar13 * 8);
        *(undefined8 *)(pcVar9 + uVar13 * 8) = uVar5;
        uVar13 = uVar13 + 1;
      } while (uVar17 != uVar13);
      uVar13 = (ulong)(uVar16 & 7);
    }
    if (uVar13 != 0) {
      uVar10 = 0;
      do {
        cVar2 = pcVar14[uVar10];
        pcVar14[uVar10] = pcVar9[uVar10];
        pcVar9[uVar10] = cVar2;
        uVar10 = uVar10 + 1;
      } while (uVar13 != uVar10);
    }
  }
  if (uVar7 != uVar8) {
    if (size < 8) {
      if (size < 4) {
        uVar13 = (ulong)(uVar16 & 1);
        if (1 < size) {
          uVar3 = *(undefined2 *)pcVar20;
          *(undefined2 *)pcVar20 = *(undefined2 *)pcVar9;
          *(undefined2 *)pcVar9 = uVar3;
        }
      }
      else {
        uVar13 = (ulong)(uVar16 & 3);
        uVar4 = *(undefined4 *)pcVar20;
        *(undefined4 *)pcVar20 = *(undefined4 *)pcVar9;
        *(undefined4 *)pcVar9 = uVar4;
      }
    }
    else {
      uVar13 = 0;
      do {
        uVar5 = *(undefined8 *)(pcVar20 + uVar13 * 8);
        *(undefined8 *)(pcVar20 + uVar13 * 8) = *(undefined8 *)(pcVar9 + uVar13 * 8);
        *(undefined8 *)(pcVar9 + uVar13 * 8) = uVar5;
        uVar13 = uVar13 + 1;
      } while (uVar17 != uVar13);
      uVar13 = (ulong)(uVar16 & 7);
    }
    if (uVar13 != 0) {
      uVar10 = 0;
      do {
        cVar2 = pcVar20[uVar10];
        pcVar20[uVar10] = pcVar9[uVar10];
        pcVar9[uVar10] = cVar2;
        uVar10 = uVar10 + 1;
      } while (uVar13 != uVar10);
    }
  }
  if (uVar8 == 0) {
    local_40 = 0;
    uVar13 = 0;
  }
  else {
    uVar13 = 0;
    local_40 = 0;
    pcVar14 = base;
    do {
      pcVar1 = base + uVar13;
      iVar6 = (*comparer)(context,pcVar1,pcVar20);
      if (iVar6 < 1) {
        if (uVar13 != local_40 * size) {
          pcVar9 = base + local_40 * size;
          if (size < 8) {
            if (size < 4) {
              uVar10 = (ulong)(uVar16 & 1);
              if (1 < size) {
                uVar3 = *(undefined2 *)pcVar1;
                *(undefined2 *)pcVar1 = *(undefined2 *)pcVar9;
                *(undefined2 *)pcVar9 = uVar3;
              }
            }
            else {
              uVar4 = *(undefined4 *)pcVar1;
              *(undefined4 *)pcVar1 = *(undefined4 *)pcVar9;
              *(undefined4 *)pcVar9 = uVar4;
              uVar10 = (ulong)(uVar16 & 3);
            }
          }
          else {
            uVar11 = 0;
            do {
              uVar5 = *(undefined8 *)(pcVar14 + uVar11 * 8);
              *(undefined8 *)(pcVar14 + uVar11 * 8) = *(undefined8 *)(pcVar9 + uVar11 * 8);
              *(undefined8 *)(pcVar9 + uVar11 * 8) = uVar5;
              uVar11 = uVar11 + 1;
              uVar10 = (ulong)(uVar16 & 7);
            } while (uVar17 != uVar11);
          }
          if (uVar10 != 0) {
            uVar11 = 0;
            do {
              cVar2 = pcVar14[uVar11];
              pcVar14[uVar11] = pcVar9[uVar11];
              pcVar9[uVar11] = cVar2;
              uVar11 = uVar11 + 1;
            } while (uVar10 != uVar11);
          }
        }
        local_40 = local_40 + 1;
      }
      uVar13 = uVar13 + size;
      pcVar14 = pcVar14 + size;
    } while (uVar13 < uVar8);
  }
  if (uVar13 < uVar7) {
    pcVar14 = base + uVar13;
    do {
      pcVar1 = base + uVar13;
      iVar6 = (*comparer)(context,pcVar1,pcVar20);
      if (iVar6 < 0) {
        if (uVar13 != local_40 * size) {
          pcVar9 = base + local_40 * size;
          if (size < 8) {
            if (size < 4) {
              uVar10 = (ulong)(uVar16 & 1);
              if (1 < size) {
                uVar3 = *(undefined2 *)pcVar1;
                *(undefined2 *)pcVar1 = *(undefined2 *)pcVar9;
                *(undefined2 *)pcVar9 = uVar3;
              }
            }
            else {
              uVar4 = *(undefined4 *)pcVar1;
              *(undefined4 *)pcVar1 = *(undefined4 *)pcVar9;
              *(undefined4 *)pcVar9 = uVar4;
              uVar10 = (ulong)(uVar16 & 3);
            }
          }
          else {
            uVar8 = 0;
            do {
              uVar5 = *(undefined8 *)(pcVar14 + uVar8 * 8);
              *(undefined8 *)(pcVar14 + uVar8 * 8) = *(undefined8 *)(pcVar9 + uVar8 * 8);
              *(undefined8 *)(pcVar9 + uVar8 * 8) = uVar5;
              uVar8 = uVar8 + 1;
              uVar10 = (ulong)(uVar16 & 7);
            } while (uVar17 != uVar8);
          }
          if (uVar10 != 0) {
            uVar8 = 0;
            do {
              cVar2 = pcVar14[uVar8];
              pcVar14[uVar8] = pcVar9[uVar8];
              pcVar9[uVar8] = cVar2;
              uVar8 = uVar8 + 1;
            } while (uVar10 != uVar8);
          }
        }
        local_40 = local_40 + 1;
      }
      uVar13 = uVar13 + size;
      pcVar14 = pcVar14 + size;
    } while (uVar13 < uVar7);
  }
  if (local_40 * size - uVar7 != 0) {
    pcVar14 = base + local_40 * size;
    if (size < 8) {
      if (size < 4) {
        uVar13 = (ulong)(uVar16 & 1);
        if (1 < size) {
          uVar3 = *(undefined2 *)pcVar14;
          *(undefined2 *)pcVar14 = *(undefined2 *)pcVar20;
          *(undefined2 *)pcVar20 = uVar3;
        }
      }
      else {
        uVar13 = (ulong)(uVar16 & 3);
        uVar4 = *(undefined4 *)pcVar14;
        *(undefined4 *)pcVar14 = *(undefined4 *)pcVar20;
        *(undefined4 *)pcVar20 = uVar4;
      }
    }
    else {
      uVar13 = 0;
      do {
        uVar5 = *(undefined8 *)(pcVar14 + uVar13 * 8);
        *(undefined8 *)(pcVar14 + uVar13 * 8) = *(undefined8 *)(pcVar20 + uVar13 * 8);
        *(undefined8 *)(pcVar20 + uVar13 * 8) = uVar5;
        uVar13 = uVar13 + 1;
      } while (uVar17 != uVar13);
      uVar13 = (ulong)(uVar16 & 7);
    }
    if (uVar13 != 0) {
      uVar7 = 0;
      do {
        cVar2 = pcVar14[uVar7];
        pcVar14[uVar7] = pcVar20[uVar7];
        pcVar20[uVar7] = cVar2;
        uVar7 = uVar7 + 1;
      } while (uVar13 != uVar7);
    }
  }
  Sort(base,local_40,size,comparer,context);
  nmemb = nmemb - (local_40 + 1);
  base = base + (local_40 + 1) * size;
  goto LAB_003b217f;
}

Assistant:

static void Sort(T* base, size_t nmemb, size_t size, Comparer comparer, void* context)
        {
            if (!base)
            {
                return;
            }

            if (nmemb <= 9) // use sorting networks for members <= 2^3
            {
                switch(nmemb)
                {
                    case 9:
                        CCQ_SORT9()
                        break;
                    case 8:
                        CCQ_SORT8()
                        break;
                    case 7:
                        CCQ_SORT7()
                        break;
                    case 6:
                        CCQ_SORT6()
                        break;
                    case 5:
                        CCQ_SORT5(0, 1, 2, 3, 4)
                        break;
                    case 4:
                        CCQ_SORT4()
                        break;
                    case 3:
                        CCQ_SORT3()
                        break;
                    case 2:
                        CCQ_SORT2(0, 1)
                        break;
                    default:
                        break; // nothing to sort
                }

                return;
            }

            CCQ_SORT5(0, (nmemb / 4), (nmemb / 2), ((3 * nmemb) / 4), (nmemb - 1));
            // guess the median is in the middle now.
            size_t pos = 0;
            const size_t pivot = (nmemb - 1) * size;
            // make last element the median(pivot)
            CCQ_SWAP(base + pivot, base + ((nmemb / 2) * size), size);

            // standard qsort pt. below
            size_t i = 0;
            for (; i < nmemb / 2 * size; i+= size)
            {
                // During the first half, count equal values as below the pivot
                if (comparer(context, base + i, base + pivot) <= 0)
                {
                    CCQ_SWAP(base + i, base + (pos * size), size);
                    pos++;
                }
            }

            for (; i < pivot; i+= size)
            {
                // During the second half, count equal values as above the pivot
                if (comparer(context, base + i, base + pivot) < 0)
                {
                    CCQ_SWAP(base + i, base + (pos * size), size);
                    pos++;
                }
            }

            // issue the last change
            CCQ_SWAP(base + (pos * size), base + pivot, size);

            Sort(base, pos++, size, comparer, context);
            Sort(base + (pos * size), nmemb - pos, size, comparer, context);
        }